

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O2

void opj_read_bytes_LE(OPJ_BYTE *p_buffer,OPJ_UINT32 *p_value,OPJ_UINT32 p_nb_bytes)

{
  OPJ_BYTE OVar1;
  ulong uVar2;
  
  if (p_nb_bytes - 1 < 4) {
    *p_value = 0;
    for (uVar2 = (ulong)p_nb_bytes; (int)uVar2 != 0; uVar2 = uVar2 - 1) {
      OVar1 = *p_buffer;
      p_buffer = p_buffer + 1;
      *(OPJ_BYTE *)((long)p_value + (uVar2 - 1)) = OVar1;
    }
    return;
  }
  __assert_fail("p_nb_bytes > 0 && p_nb_bytes <= sizeof(OPJ_UINT32)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/cio.c"
                ,0x58,"void opj_read_bytes_LE(const OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32)");
}

Assistant:

void opj_read_bytes_LE(const OPJ_BYTE * p_buffer, OPJ_UINT32 * p_value,
                       OPJ_UINT32 p_nb_bytes)
{
    OPJ_BYTE * l_data_ptr = ((OPJ_BYTE *) p_value) + p_nb_bytes - 1;
    OPJ_UINT32 i;

    assert(p_nb_bytes > 0 && p_nb_bytes <= sizeof(OPJ_UINT32));

    *p_value = 0;
    for (i = 0; i < p_nb_bytes; ++i) {
        *(l_data_ptr--) = *(p_buffer++);
    }
}